

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
vkt::ssbo::anon_unknown_15::computeBufferSizes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ShaderInterface *interface,
          BufferLayout *layout)

{
  BlockLayoutEntry *entry;
  int iVar1;
  int iVar2;
  pointer ppBVar3;
  _Alloc_hider __lhs;
  pointer pBVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int local_d4;
  BufferBlock *local_d0;
  ShaderInterface *local_c8;
  long local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string apiName;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = interface;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->blocks).
                   super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_b0);
  for (local_c0 = 0;
      ppBVar3 = (local_c8->m_bufferBlocks).
                super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      local_c0 <
      (int)((ulong)((long)(local_c8->m_bufferBlocks).
                          super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3) >> 3);
      local_c0 = local_c0 + 1) {
    local_d0 = ppBVar3[local_c0];
    local_b8 = (ulong)(uint)local_d0->m_arraySize;
    if (local_d0->m_arraySize < 2) {
      local_b8 = 1;
    }
    uVar8 = 0;
    while( true ) {
      if (local_b8 == uVar8) break;
      local_d4 = (int)uVar8;
      __lhs._M_p = (local_d0->m_blockName)._M_dataplus._M_p;
      iVar1 = local_d0->m_arraySize;
      if (iVar1 < 1) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
      }
      else {
        de::toString<int>(&local_70,&local_d4);
        std::operator+(&local_50,"[",&local_70);
        std::operator+(&local_b0,&local_50,"]");
      }
      std::operator+(&apiName,__lhs._M_p,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (0 < iVar1) {
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      uVar6 = BufferLayout::getBlockIndex(layout,&apiName);
      if (-1 < (int)uVar6) {
        pBVar4 = (layout->blocks).
                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        entry = pBVar4 + uVar6;
        iVar1 = pBVar4[uVar6].size;
        bVar5 = hasUnsizedArray(layout,entry);
        iVar7 = 0;
        if (bVar5) {
          iVar2 = *(int *)(*(long *)&(local_d0->m_lastUnsizedArraySizes).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + uVar8 * 4);
          iVar7 = getUnsizedArrayStride(layout,entry);
          iVar7 = iVar7 * iVar2;
        }
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] = iVar7 + iVar1;
      }
      std::__cxx11::string::~string((string *)&apiName);
      uVar8 = uVar8 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> computeBufferSizes (const ShaderInterface& interface, const BufferLayout& layout)
{
	vector<int> sizes(layout.blocks.size());

	for (int declNdx = 0; declNdx < interface.getNumBlocks(); declNdx++)
	{
		const BufferBlock&	block			= interface.getBlock(declNdx);
		const bool			isArray			= block.isArray();
		const int			numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			const string	apiName		= getBlockAPIName(block, instanceNdx);
			const int		blockNdx	= layout.getBlockIndex(apiName);

			if (blockNdx >= 0)
			{
				const BlockLayoutEntry&		blockLayout		= layout.blocks[blockNdx];
				const int					baseSize		= blockLayout.size;
				const bool					isLastUnsized	= hasUnsizedArray(layout, blockLayout);
				const int					lastArraySize	= isLastUnsized ? block.getLastUnsizedArraySize(instanceNdx) : 0;
				const int					stride			= isLastUnsized ? getUnsizedArrayStride(layout, blockLayout) : 0;

				sizes[blockNdx] = baseSize + lastArraySize*stride;
			}
		}
	}

	return sizes;
}